

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

void Llb_ManFlowPrepareCut(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  undefined1 *puVar1;
  ulong *puVar2;
  void *pvVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      pvVar3 = pVVar5->pArray[lVar4];
      if (pvVar3 != (void *)0x0) {
        *(ulong *)((long)pvVar3 + 0x18) =
             *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffcf | 0x20;
        pVVar5 = p->vObjs;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar5->nSize);
  }
  puVar1 = &p->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffffffffffdf;
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      puVar2 = (ulong *)((long)pVVar5->pArray[lVar4] + 0x18);
      *puVar2 = *puVar2 & 0xffffffffffffffdf;
      lVar4 = lVar4 + 1;
      pVVar5 = p->vCis;
    } while (lVar4 < pVVar5->nSize);
  }
  if (0 < vUpper->nSize) {
    lVar4 = 0;
    do {
      Llb_ManFlowCleanMarkB_rec((Aig_Obj_t *)vUpper->pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vUpper->nSize);
  }
  if (0 < vLower->nSize) {
    lVar4 = 0;
    do {
      if ((((Aig_Obj_t *)vLower->pArray[lVar4])->field_0x18 & 0x20) != 0) {
        __assert_fail("pObj->fMarkB == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                      ,0x3d3,"void Llb_ManFlowPrepareCut(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
      }
      Llb_ManFlowSetMarkA_rec((Aig_Obj_t *)vLower->pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vLower->nSize);
  }
  return;
}

Assistant:

void Llb_ManFlowPrepareCut( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Aig_Obj_t * pObj;
    int i;
    // reset marks
    Aig_ManForEachObj( p, pObj, i )
    {
        pObj->fMarkA = 0;
        pObj->fMarkB = 1;
    }
    // clean PIs and const
    Aig_ManConst1(p)->fMarkB = 0;
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkB = 0;
    // clean upper cut
//printf( "Upper: ");
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
    {
        Llb_ManFlowCleanMarkB_rec( pObj );
//printf( "%d ", pObj->Id );
    }
//printf( "\n" );
    // set lower cut
//printf( "Lower: ");
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
    {
//printf( "%d ", pObj->Id );
        assert( pObj->fMarkB == 0 );
        Llb_ManFlowSetMarkA_rec( pObj );
    }
//printf( "\n" );
}